

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

SignWithPrivkeyRequestStruct * __thiscall
cfd::js::api::json::SignWithPrivkeyRequest::ConvertToStruct
          (SignWithPrivkeyRequestStruct *__return_storage_ptr__,SignWithPrivkeyRequest *this)

{
  SignWithPrivkeyTxInRequestStruct SStack_168;
  
  SignWithPrivkeyRequestStruct::SignWithPrivkeyRequestStruct(__return_storage_ptr__);
  __return_storage_ptr__->is_elements = this->is_elements_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->tx);
  SignWithPrivkeyTxInRequest::ConvertToStruct(&SStack_168,&this->txin_);
  SignWithPrivkeyTxInRequestStruct::operator=(&__return_storage_ptr__->txin,&SStack_168);
  SignWithPrivkeyTxInRequestStruct::~SignWithPrivkeyTxInRequestStruct(&SStack_168);
  core::JsonObjectVector<cfd::js::api::json::UtxoObject,_cfd::js::api::UtxoObjectStruct>::
  ConvertToStruct((vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>
                   *)&SStack_168,&this->utxos_);
  std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
  _M_move_assign(&__return_storage_ptr__->utxos,&SStack_168);
  std::vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_>::
  ~vector((vector<cfd::js::api::UtxoObjectStruct,_std::allocator<cfd::js::api::UtxoObjectStruct>_> *
          )&SStack_168);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

SignWithPrivkeyRequestStruct SignWithPrivkeyRequest::ConvertToStruct() const {  // NOLINT
  SignWithPrivkeyRequestStruct result;
  result.is_elements = is_elements_;
  result.tx = tx_;
  result.txin = txin_.ConvertToStruct();
  result.utxos = utxos_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}